

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O0

void resolve_vex_pp(pt_ild *ild,uint8_t pp)

{
  uint8_t pp_local;
  pt_ild *ild_local;
  
  if (pp == '\x01') {
    *(ushort *)&ild->field_0x10 = *(ushort *)&ild->field_0x10 & 0xfffe | 1;
  }
  else if (pp == '\x02') {
    *(ushort *)&ild->field_0x10 = *(ushort *)&ild->field_0x10 & 0xfff7 | 8;
    *(ushort *)&ild->field_0x10 = *(ushort *)&ild->field_0x10 & 0xff9f | 0x60;
  }
  else if (pp == '\x03') {
    *(ushort *)&ild->field_0x10 = *(ushort *)&ild->field_0x10 & 0xffef | 0x10;
    *(ushort *)&ild->field_0x10 = *(ushort *)&ild->field_0x10 & 0xff9f | 0x40;
  }
  return;
}

Assistant:

static void resolve_vex_pp(struct pt_ild *ild, uint8_t pp)
{
	switch (pp) {
	case 0x01:
		ild->osz = 1;
		break;

	case 0x02:
		ild->f3 = 1;
		ild->last_f2f3 = 3;
		break;

	case 0x03:
		ild->f2 = 1;
		ild->last_f2f3 = 2;
		break;
	}
}